

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
std::_Tuple_impl<7ul,testing::Matcher<int>,testing::Matcher<int>>::
_Tuple_impl<testing::Matcher<int>,testing::Matcher<int>,void>
          (_Tuple_impl<7UL,_testing::Matcher<int>,_testing::Matcher<int>_> *this,
          Matcher<int> *__head,Matcher<int> *__tail)

{
  (this->super__Tuple_impl<8UL,_testing::Matcher<int>_>).
  super__Head_base<8UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.vtable_ =
       (__tail->super_MatcherBase<int>).vtable_;
  (this->super__Tuple_impl<8UL,_testing::Matcher<int>_>).
  super__Head_base<8UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.buffer_ =
       (__tail->super_MatcherBase<int>).buffer_;
  (__tail->super_MatcherBase<int>).vtable_ = (VTable *)0x0;
  (this->super__Tuple_impl<8UL,_testing::Matcher<int>_>).
  super__Head_base<8UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0017f388;
  (this->super__Head_base<7UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  vtable_ = (__head->super_MatcherBase<int>).vtable_;
  (this->super__Head_base<7UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  buffer_ = (__head->super_MatcherBase<int>).buffer_;
  (__head->super_MatcherBase<int>).vtable_ = (VTable *)0x0;
  (this->super__Head_base<7UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0017f388;
  return;
}

Assistant:

MatcherBase(MatcherBase&& other)
      : vtable_(other.vtable_), buffer_(other.buffer_) {
    other.vtable_ = nullptr;
  }